

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::Directory::SetCurrentSource(Directory *this,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PointerType pBVar2;
  PointerType pSVar3;
  PointerType this_00;
  string *path;
  allocator local_59;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar2->Location;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_58,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_58);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  cmsys::SystemTools::SplitPath(path,&pBVar2->CurrentSourceDirectoryComponents,true);
  ComputeRelativePathTopSource(this);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  std::__cxx11::string::string((string *)local_38,(path->_M_dataplus)._M_p,&local_59);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  this_00 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Vars);
  cmDefinitions::Set(this_00,&local_58,(char *)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmState::Directory::SetCurrentSource(std::string const& dir)
{
  std::string& loc = this->DirectoryState->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->DirectoryState->CurrentSourceDirectoryComponents);
  this->ComputeRelativePathTopSource();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_SOURCE_DIR", loc.c_str());
}